

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O3

void __thiscall
SplitOnceTest_random_view_Test<unsigned_char>::TestBody
          (SplitOnceTest_random_view_Test<unsigned_char> *this)

{
  char *pcVar1;
  pair<std::basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_>,_std::basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_>_>
  split_result;
  RandomTestData<unsigned_char,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
  data;
  AssertHelper local_d0 [8];
  Message local_c8;
  undefined7 uStack_c7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  undefined1 local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
  local_a8;
  basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_> local_98;
  basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_> local_88;
  RandomTestData<unsigned_char,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
  local_70;
  
  RandomTestData<unsigned_char,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
  ::RandomTestData(&local_70,'\0',0,0);
  if ((long)local_70.m_str._M_string_length < 1) {
    local_88._M_len = 0;
    local_88._M_str = (pointer)0x0;
    local_98._M_len = 0;
    local_98._M_str = (pointer)0x0;
  }
  else {
    local_98._M_len = 0;
    do {
      if (local_70.m_str._M_dataplus._M_p[local_98._M_len] == '\0') {
        local_88._M_str = local_70.m_str._M_dataplus._M_p + local_98._M_len + 1;
        local_88._M_len = ~local_98._M_len + local_70.m_str._M_string_length;
        local_98._M_str = local_70.m_str._M_dataplus._M_p;
        goto LAB_0032cc31;
      }
      local_98._M_len = local_98._M_len + 1;
    } while (local_70.m_str._M_string_length != local_98._M_len);
    local_98._M_len = local_70.m_str._M_string_length;
    local_98._M_str = local_70.m_str._M_dataplus._M_p;
    local_88._M_len = 0;
    local_88._M_str = (pointer)0x0;
  }
LAB_0032cc31:
  testing::internal::
  CmpHelperEQ<std::basic_string_view<unsigned_char,std::char_traits<unsigned_char>>,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
            ((internal *)local_b8,"split_result.first","data.m_tokens[0]",&local_98,
             local_70.m_tokens.
             super__Vector_base<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>,_std::allocator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message(&local_c8);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0x91,pcVar1);
    testing::internal::AssertHelper::operator=(local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(local_d0);
    if ((long *)CONCAT71(uStack_c7,local_c8) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_c7,local_c8) + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  RandomTestData<unsigned_char,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
  ::get_remainder((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                   *)local_b8,&local_70,1);
  testing::internal::
  CmpHelperEQ<std::basic_string_view<unsigned_char,std::char_traits<unsigned_char>>,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
            ((internal *)&local_c8,"split_result.second","data.get_remainder(1)",&local_88,
             (basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
              *)local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)CONCAT71(local_b8._1_7_,local_b8[0]) != &local_a8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
                     *)CONCAT71(local_b8._1_7_,local_b8[0]),local_a8._M_allocated_capacity + 1);
  }
  if (local_c8 == (Message)0x0) {
    testing::Message::Message((Message *)local_b8);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0x92,pcVar1);
    testing::internal::AssertHelper::operator=(local_d0,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_d0);
    if ((long *)CONCAT71(local_b8._1_7_,local_b8[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_b8._1_7_,local_b8[0]) + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  std::
  vector<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>,_std::allocator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_70.m_tokens);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_70.m_str._M_dataplus._M_p != &local_70.m_str.field_2) {
    operator_delete(local_70.m_str._M_dataplus._M_p,local_70.m_str.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_70.m_delim._M_dataplus._M_p != &local_70.m_delim.field_2) {
    operator_delete(local_70.m_delim._M_dataplus._M_p,
                    local_70.m_delim.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TYPED_TEST(SplitOnceTest, random_view) {
	RandomTestData<TypeParam> data{};
	std::pair<std::basic_string_view<TypeParam>, std::basic_string_view<TypeParam>> split_result = split_once_view(data.m_str, default_delim<TypeParam>);

	EXPECT_EQ(split_result.first, data.m_tokens[0]);
	EXPECT_EQ(split_result.second, data.get_remainder(1));
}